

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::Writer::initializeLogger(Writer *this,string *loggerId,bool lookup,bool needLock)

{
  undefined *puVar1;
  string *id;
  bool bVar2;
  EnumType EVar3;
  EnumType EVar4;
  element_type *peVar5;
  RegisteredLoggers *pRVar6;
  Logger *pLVar7;
  Writer *pWVar8;
  bool local_169;
  Writer local_f0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  byte local_1a;
  undefined1 local_19;
  bool needLock_local;
  string *psStack_18;
  bool lookup_local;
  string *loggerId_local;
  Writer *this_local;
  
  local_1a = needLock;
  local_19 = lookup;
  psStack_18 = loggerId;
  loggerId_local = (string *)this;
  if (lookup) {
    peVar5 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)elStorage);
    pRVar6 = Storage::registeredLoggers(peVar5);
    id = psStack_18;
    peVar5 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)elStorage);
    bVar2 = Storage::hasFlag(peVar5,CreateLoggerAutomatically);
    pLVar7 = RegisteredLoggers::get(pRVar6,id,bVar2);
    this->m_logger = pLVar7;
  }
  if (this->m_logger == (Logger *)0x0) {
    peVar5 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)elStorage);
    (**(peVar5->super_ThreadSafe)._vptr_ThreadSafe)();
    peVar5 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)elStorage);
    pRVar6 = Storage::registeredLoggers(peVar5);
    puVar1 = consts::kDefaultLoggerId;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,puVar1,&local_41);
    bVar2 = RegisteredLoggers::has(pRVar6,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      peVar5 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)elStorage);
      pRVar6 = Storage::registeredLoggers(peVar5);
      puVar1 = consts::kDefaultLoggerId;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_78,puVar1,&local_79);
      RegisteredLoggers::get(pRVar6,&local_78,true);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    peVar5 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)elStorage);
    (*(peVar5->super_ThreadSafe)._vptr_ThreadSafe[1])();
    Writer(&local_f0,Debug,this->m_file,this->m_line,this->m_func,NormalLog,0);
    pWVar8 = construct(&local_f0,1,consts::kDefaultLoggerId);
    pWVar8 = operator<<(pWVar8,(char (*) [9])"Logger [");
    pWVar8 = operator<<(pWVar8,psStack_18);
    operator<<(pWVar8,(char (*) [25])"] is not registered yet!");
    ~Writer(&local_f0);
    this->m_proceed = false;
  }
  else {
    if ((local_1a & 1) != 0) {
      (**(this->m_logger->super_ThreadSafe)._vptr_ThreadSafe)();
    }
    peVar5 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)elStorage);
    bVar2 = Storage::hasFlag(peVar5,HierarchicalLogging);
    if (bVar2) {
      if (this->m_level == Verbose) {
        local_169 = Logger::enabled(this->m_logger,this->m_level);
      }
      else {
        EVar3 = LevelHelper::castToInt(this->m_level);
        peVar5 = std::
                 __shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)elStorage);
        EVar4 = LevelHelper::castToInt(peVar5->m_loggingLevel);
        local_169 = EVar4 <= EVar3;
      }
      this->m_proceed = local_169;
    }
    else {
      bVar2 = Logger::enabled(this->m_logger,this->m_level);
      this->m_proceed = bVar2;
    }
  }
  return;
}

Assistant:

void initializeLogger(const std::string& loggerId, bool lookup = true, bool needLock = true) {
        if (lookup) {
            m_logger = ELPP->registeredLoggers()->get(loggerId, ELPP->hasFlag(LoggingFlag::CreateLoggerAutomatically));
        }
        if (m_logger == nullptr) {
            ELPP->acquireLock();
            if (!ELPP->registeredLoggers()->has(std::string(base::consts::kDefaultLoggerId))) {
                // Somehow default logger has been unregistered. Not good! Register again
                ELPP->registeredLoggers()->get(std::string(base::consts::kDefaultLoggerId));
            }
            ELPP->releaseLock();  // Need to unlock it for next writer
            Writer(Level::Debug, m_file, m_line, m_func).construct(1, base::consts::kDefaultLoggerId)
                    << "Logger [" << loggerId << "] is not registered yet!";
            m_proceed = false;
        } else {
            if (needLock) {
                m_logger->acquireLock();  // This should not be unlocked by checking m_proceed because
                                          // m_proceed can be changed by lines below
            }
            if (ELPP->hasFlag(LoggingFlag::HierarchicalLogging)) {
                m_proceed = m_level == Level::Verbose ? m_logger->enabled(m_level) :
                        LevelHelper::castToInt(m_level) >= LevelHelper::castToInt(ELPP->m_loggingLevel);
            } else {
                m_proceed = m_logger->enabled(m_level);
            }
        }
    }